

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

char * parasail_reverse(char *s,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (char *)malloc(length + 1);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_reverse",length + 1);
  }
  else {
    pcVar1[length] = '\0';
    pcVar2 = pcVar1;
    if (length != 0) {
      do {
        *pcVar2 = s[length - 1];
        length = length - 1;
        pcVar2 = pcVar2 + 1;
      } while (length != 0);
    }
  }
  return pcVar1;
}

Assistant:

char* parasail_reverse(const char *s, size_t length)
{
    char *r = NULL;
    size_t i = 0;
    size_t j = 0;

    PARASAIL_CALLOC(r, char, length+1);
    r[length] = '\0';
    for (i=0,j=length-1; i<length; ++i,--j) {
        r[i] = s[j];
    }

    return r;
}